

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoSimulate(Gia_IsoMan_t *p,int Iter)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  
  pGVar8 = p->pGia;
  puVar1 = &pGVar8->pObjs->Value;
  *puVar1 = *puVar1 + 0x1b47586d;
  iVar9 = 0;
  while ((iVar9 < pGVar8->vCis->nSize - pGVar8->nRegs &&
         (pGVar5 = Gia_ManCi(pGVar8,iVar9), pGVar5 != (Gia_Obj_t *)0x0))) {
    pGVar5->Value = pGVar5->Value + 0xfbea205c;
    iVar9 = iVar9 + 1;
    pGVar8 = p->pGia;
  }
  if (Iter == 0) {
    iVar9 = 0;
    while( true ) {
      pGVar8 = p->pGia;
      if ((pGVar8->nRegs <= iVar9) ||
         (pGVar5 = Gia_ManCi(pGVar8,(pGVar8->vCis->nSize - pGVar8->nRegs) + iVar9),
         pGVar5 == (Gia_Obj_t *)0x0)) break;
      pGVar5->Value = pGVar5->Value + 0x22924fcd;
      iVar9 = iVar9 + 1;
    }
  }
  iVar9 = 0;
  while ((iVar9 < p->pGia->nObjs && (pGVar5 = Gia_ManObj(p->pGia,iVar9), pGVar5 != (Gia_Obj_t *)0x0)
         )) {
    uVar2 = (uint)*(ulong *)pGVar5;
    uVar6 = *(ulong *)pGVar5 & 0x1fffffff;
    if (uVar6 != 0x1fffffff && -1 < (int)uVar2) {
      uVar3 = pGVar5[-uVar6].Value;
      uVar2 = Gia_IsoUpdate(p,Iter,iVar9 - (uVar2 & 0x1fffffff),uVar2 >> 0x1d & 1);
      pGVar5->Value = pGVar5->Value + uVar2 + uVar3;
      uVar3 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20);
      uVar2 = pGVar5[-(ulong)(uVar3 & 0x1fffffff)].Value;
      uVar3 = Gia_IsoUpdate(p,Iter,iVar9 - (uVar3 & 0x1fffffff),uVar3 >> 0x1d & 1);
      pGVar5->Value = pGVar5->Value + uVar3 + uVar2;
    }
    iVar9 = iVar9 + 1;
  }
  iVar9 = 0;
  while ((iVar9 < p->pGia->vCos->nSize &&
         (pGVar5 = Gia_ManCo(p->pGia,iVar9), pGVar5 != (Gia_Obj_t *)0x0))) {
    iVar4 = Gia_ObjId(p->pGia,pGVar5);
    uVar3 = (uint)*(undefined8 *)pGVar5 & 0x1fffffff;
    uVar2 = pGVar5[-(ulong)uVar3].Value;
    uVar3 = Gia_IsoUpdate(p,Iter,iVar4 - uVar3,(uint)*(undefined8 *)pGVar5 >> 0x1d & 1);
    pGVar5->Value = pGVar5->Value + uVar3 + uVar2;
    iVar9 = iVar9 + 1;
  }
  iVar9 = 0;
  while( true ) {
    pGVar8 = p->pGia;
    if (pGVar8->nRegs <= iVar9) {
      return;
    }
    pGVar5 = Gia_ManCo(pGVar8,(pGVar8->vCos->nSize - pGVar8->nRegs) + iVar9);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    pGVar8 = p->pGia;
    pGVar7 = Gia_ManCi(pGVar8,(pGVar8->vCis->nSize - pGVar8->nRegs) + iVar9);
    if (pGVar7 == (Gia_Obj_t *)0x0) {
      return;
    }
    pGVar7->Value = pGVar7->Value + pGVar5->Value;
    iVar9 = iVar9 + 1;
  }
  return;
}

Assistant:

void Gia_IsoSimulate( Gia_IsoMan_t * p, int Iter )
{
    Gia_Obj_t * pObj, * pObjF;
    int i, iObj;
    // initialize constant, inputs, and flops in the first frame
    Gia_ManConst0(p->pGia)->Value += s_256Primes[ISO_MASK];
    Gia_ManForEachPi( p->pGia, pObj, i )
        pObj->Value += s_256Primes[ISO_MASK-1];
    if ( Iter == 0 )
        Gia_ManForEachRo( p->pGia, pObj, i )
            pObj->Value += s_256Primes[ISO_MASK-2];
    // simulate nodes
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        pObj->Value += Gia_ObjFanin0(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj));
        pObj->Value += Gia_ObjFanin1(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId1(pObj, i), Gia_ObjFaninC1(pObj));
    }
    // simulate COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        pObj->Value += Gia_ObjFanin0(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId0(pObj, iObj), Gia_ObjFaninC0(pObj));
    }
    // transfer flop values
    Gia_ManForEachRiRo( p->pGia, pObjF, pObj, i )
        pObj->Value += pObjF->Value;
}